

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::testDraw
          (FunctionalTest3_4 *this,GLuint program_id,GLchar *first_routine_name,
          GLchar *second_routine_name,GLchar **uniform_names,vec4<float> *expected_results,
          bool use_program_query)

{
  GLchar *__s;
  GLchar *__s_00;
  FunctionalTest3_4 *pFVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  GLuint GVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  float *pfVar7;
  size_t sVar8;
  TestError *this_00;
  GLuint i;
  long lVar9;
  long lVar10;
  double extraout_XMM0_Qa;
  double dVar11;
  double extraout_XMM0_Qa_00;
  GLuint subroutine_uniforms [2];
  vec4<float> results [5];
  MessageBuilder message;
  GLuint local_3a8 [4];
  GLchar *local_398;
  GLchar *local_390;
  vec4<float> local_388;
  float local_378;
  float local_374;
  float local_370;
  float local_36c;
  float local_368;
  float local_364;
  float local_360;
  float local_35c;
  float local_358;
  float local_354;
  float local_350;
  float local_34c;
  float local_348;
  float local_344;
  float local_340;
  float local_33c;
  FunctionalTest3_4 *local_338;
  undefined1 local_330 [8];
  _func_int **local_328;
  ios_base local_2b8 [264];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_398 = second_routine_name;
  local_390 = first_routine_name;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar3);
  local_3a8[0] = 0;
  local_3a8[1] = 0;
  local_3a8[3] = getSubroutineUniformLocation(this,program_id,*uniform_names,use_program_query);
  local_3a8[2] = getSubroutineUniformLocation(this,program_id,uniform_names[1],use_program_query);
  GVar4 = getSubroutineIndex(this,program_id,local_390,use_program_query);
  local_338 = this;
  GVar5 = getSubroutineIndex(this,program_id,local_398,use_program_query);
  local_3a8[(int)local_3a8[3]] = GVar4;
  local_3a8[(int)local_3a8[2]] = GVar5;
  (**(code **)(lVar10 + 0x1668))(0x8b31,2,local_3a8);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xe7a);
  iVar3 = (**(code **)(lVar10 + 0xb48))(program_id,"input_data");
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"GetUniformLocation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xe7e);
  if (iVar3 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Uniform is not available",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0xe82);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar10 + 0x15a0))
            (expected_results->m_x,expected_results->m_y,expected_results->m_z,expected_results->m_w
             ,iVar3);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Uniform4f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xe88);
  lVar9 = 0;
  (**(code **)(lVar10 + 0x30))(0);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"BeginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xe8c);
  (**(code **)(lVar10 + 0x538))(0,0,1);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xe8f);
  (**(code **)(lVar10 + 0x638))();
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"EndTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xe92);
  pfVar7 = (float *)(**(code **)(lVar10 + 0xcf8))(0x8c8e,35000);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xe96);
  local_388.m_x = *pfVar7;
  local_388.m_y = pfVar7[1];
  local_388.m_z = pfVar7[2];
  local_388.m_w = pfVar7[3];
  local_378 = pfVar7[4];
  local_374 = pfVar7[5];
  local_370 = pfVar7[6];
  local_36c = pfVar7[7];
  local_368 = pfVar7[8];
  local_364 = pfVar7[9];
  local_360 = pfVar7[10];
  local_35c = pfVar7[0xb];
  local_358 = pfVar7[0xc];
  local_354 = pfVar7[0xd];
  local_350 = pfVar7[0xe];
  local_34c = pfVar7[0xf];
  local_348 = pfVar7[0x10];
  local_344 = pfVar7[0x11];
  local_340 = pfVar7[0x12];
  local_33c = pfVar7[0x13];
  (**(code **)(lVar10 + 0x1670))(0x8c8e);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"UnmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xeb4);
  pFVar1 = local_338;
  __s_00 = local_390;
  bVar2 = true;
  do {
    while (bVar2 == false) {
      lVar9 = lVar9 + 1;
      bVar2 = false;
      if (lVar9 == 5) {
LAB_0097872c:
        local_330 = (undefined1  [8])((pFVar1->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_328,"Error. Invalid result. First routine: ",0x26);
        __s = local_398;
        iVar3 = (int)(ostringstream *)&local_328;
        if (__s_00 == (char *)0x0) {
          std::ios::clear((int)local_328[-3] + iVar3);
        }
        else {
          sVar8 = strlen(__s_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,__s_00,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_328,". Second routine: ",0x12);
        if (__s == (char *)0x0) {
          std::ios::clear((int)local_328[-3] + iVar3);
        }
        else {
          sVar8 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,__s,sVar8);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
        std::ios_base::~ios_base(local_2b8);
        local_330 = (undefined1  [8])((pFVar1->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,"Results:",8);
        lVar10 = 0;
        dVar11 = extraout_XMM0_Qa;
        do {
          dVar11 = Utils::vec4<float>::log((vec4<float> *)((long)&local_388.m_x + lVar10),dVar11);
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0x50);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
        local_1b0._0_8_ = ((pFVar1->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        tcu::MessageBuilder::operator=((MessageBuilder *)local_330,(MessageBuilder *)local_1b0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,"Expected:",9);
        lVar10 = 0;
        dVar11 = extraout_XMM0_Qa_00;
        do {
          dVar11 = Utils::vec4<float>::log
                             ((vec4<float> *)((long)&expected_results->m_x + lVar10),dVar11);
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0x50);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
        std::ios_base::~ios_base(local_2b8);
        return false;
      }
    }
    bVar2 = Utils::vec4<float>::operator==(&local_388 + lVar9,expected_results + lVar9);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 5);
  if (bVar2) {
    return true;
  }
  goto LAB_0097872c;
}

Assistant:

bool FunctionalTest3_4::testDraw(GLuint program_id, const GLchar* first_routine_name, const GLchar* second_routine_name,
								 const GLchar** uniform_names, const Utils::vec4<GLfloat> expected_results[5],
								 bool use_program_query) const
{
	static const GLuint   n_varyings			 = 5;
	const glw::Functions& gl					 = m_context.getRenderContext().getFunctions();
	bool				  result				 = true;
	GLuint				  subroutine_uniforms[2] = { 0 };

	/* Get subroutine uniform locations */
	GLint first_routine_location = getSubroutineUniformLocation(program_id, uniform_names[0], use_program_query);

	GLint second_routine_location = getSubroutineUniformLocation(program_id, uniform_names[1], use_program_query);

	/* Get subroutine indices */
	GLuint first_routine_index = getSubroutineIndex(program_id, first_routine_name, use_program_query);

	GLuint second_routine_index = getSubroutineIndex(program_id, second_routine_name, use_program_query);

	/* Map uniforms with subroutines */
	subroutine_uniforms[first_routine_location]  = first_routine_index;
	subroutine_uniforms[second_routine_location] = second_routine_index;

	gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, 2 /* number of uniforms */, &subroutine_uniforms[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Get location of input_data */
	GLint input_data_location = gl.getUniformLocation(program_id, "input_data");
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformLocation");

	if (-1 == input_data_location)
	{
		TCU_FAIL("Uniform is not available");
	}

	/* Set up input_data */
	gl.uniform4f(input_data_location, expected_results[0].m_x, expected_results[0].m_y, expected_results[0].m_z,
				 expected_results[0].m_w);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform4f");

	/* Execute draw call with transform feedback */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BeginTransformFeedback");

	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "EndTransformFeedback");

	/* Verify results */
	GLfloat* feedback_data = (GLfloat*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	Utils::vec4<GLfloat> results[5];

	results[0].m_x = feedback_data[0];
	results[0].m_y = feedback_data[1];
	results[0].m_z = feedback_data[2];
	results[0].m_w = feedback_data[3];

	results[1].m_x = feedback_data[4];
	results[1].m_y = feedback_data[5];
	results[1].m_z = feedback_data[6];
	results[1].m_w = feedback_data[7];

	results[2].m_x = feedback_data[8];
	results[2].m_y = feedback_data[9];
	results[2].m_z = feedback_data[10];
	results[2].m_w = feedback_data[11];

	results[3].m_x = feedback_data[12];
	results[3].m_y = feedback_data[13];
	results[3].m_z = feedback_data[14];
	results[3].m_w = feedback_data[15];

	results[4].m_x = feedback_data[16];
	results[4].m_y = feedback_data[17];
	results[4].m_z = feedback_data[18];
	results[4].m_w = feedback_data[19];

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	for (GLuint i = 0; i < n_varyings; ++i)
	{
		result = result && (results[i] == expected_results[i]);
	}

	if (false == result)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Error. Invalid result. First routine: " << first_routine_name
											<< ". Second routine: " << second_routine_name << tcu::TestLog::EndMessage;

		tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		message << "Results:";

		for (GLuint i = 0; i < n_varyings; ++i)
		{
			results[i].log(message);
		}

		message << tcu::TestLog::EndMessage;

		message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		message << "Expected:";

		for (GLuint i = 0; i < n_varyings; ++i)
		{
			expected_results[i].log(message);
		}

		message << tcu::TestLog::EndMessage;
	}

	return result;
}